

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O2

void __thiscall expr_bit_slice_Test::~expr_bit_slice_Test(expr_bit_slice_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(expr, bit_slice) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &array = mod.var("array", 2, 2);
    auto &v_0 = array[0][0];
    EXPECT_EQ(v_0.var_high(), 0);
    EXPECT_EQ(v_0.var_low(), 0);

    auto &v_1 = array[0][1];
    EXPECT_EQ(v_1.var_high(), 1);
    EXPECT_EQ(v_1.var_low(), 1);
}